

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall
GlobOpt::CaptureValuesIncremental
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  CapturedValues *pCVar1;
  Sym *this_00;
  JitArenaAllocator *pJVar2;
  code *pcVar3;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar4
  ;
  NodeBase *pNVar5;
  bool bVar6;
  BOOLEAN BVar7;
  uint key;
  undefined4 *puVar8;
  Type_conflict pSVar9;
  Type *pTVar10;
  Type *pTVar11;
  StackSym *pSVar12;
  Value *pVVar13;
  HashBucket *pHVar14;
  ValueInfo *this_01;
  Sym *pSVar15;
  VarConstantValueInfo *this_02;
  Var value;
  StackSym *pSVar16;
  StackSym *this_03;
  BailoutConstantValue param2;
  BailoutConstantValue param2_00;
  BailoutConstantValue param2_01;
  BailoutConstantValue BVar17;
  StackSym *local_270;
  StackSym *local_240;
  StackSym *local_228;
  StackSym *local_1f0;
  bool local_1e1;
  bool local_1c9;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *local_1b8;
  CapturedValues *local_1b0;
  StackSym *capturedCopyPropSym_1;
  Sym *capturedSym_1;
  Sym *constSym_1;
  undefined1 local_158 [8];
  BailoutConstantValue constValue;
  int32 intConstValue;
  ValueInfo *valueInfo;
  Sym *symIdSym;
  HashBucket<Sym_*,_Value_*> *symIdBucket;
  StackSym *capturedCopyPropSym;
  Sym *capturedSym;
  StackSym *local_108;
  Sym *constSym;
  Value *val;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex symId;
  bool hasCopyPropSym;
  bool hasConstValue;
  Iterator iterCopyPropSym;
  Iterator iterConst;
  CapturedValues *currCapturedValues;
  BVSparse<Memory::JitArenaAllocator> *argsToCapture_local;
  EditingIterator *bailOutCopySymsIter_local;
  EditingIterator *bailOutConstValuesIter_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  bool local_79;
  bool local_69;
  bool local_59;
  bool local_49;
  bool local_39;
  bool local_29;
  bool local_19;
  bool local_9;
  
  pCVar1 = (block->globOptData).capturedValues;
  local_1b0 = pCVar1;
  if (pCVar1 == (CapturedValues *)0x0) {
    local_1b0 = (CapturedValues *)0x0;
  }
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::Iterator::Iterator((Iterator *)&iterCopyPropSym.current,&local_1b0->constantValues);
  if (pCVar1 == (CapturedValues *)0x0) {
    local_1b8 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0;
  }
  else {
    local_1b8 = &pCVar1->copyPropSyms;
  }
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
  Iterator::Iterator((Iterator *)&symId,local_1b8);
  if (pCVar1 == (CapturedValues *)0x0) {
    local_1c9 = false;
  }
  else {
    if (iterConst.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pNVar5 = iterCopyPropSym.current;
    pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_49 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                         *)pNVar5,pSVar9);
    if (local_49) {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_49 = !local_49;
    local_1c9 = local_49;
  }
  if (pCVar1 == (CapturedValues *)0x0) {
    local_1e1 = false;
  }
  else {
    if (iterCopyPropSym.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pSVar4 = _symId;
    pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_9 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::IsHead(pSVar4,pSVar9);
    if (local_9) {
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_9 = !local_9;
    local_1e1 = local_9;
  }
  BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,0xffffffff);
  if (argsToCapture != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Or((block->globOptData).changedSyms,argsToCapture);
  }
  local_59 = local_1c9;
  local_19 = local_1e1;
  for (__startIndex = ((block->globOptData).changedSyms)->head; local_79 = local_59,
      local_39 = local_19, __startIndex != (Type_conflict)0x0; __startIndex = __startIndex->next) {
    _unit.word._0_4_ = __startIndex->startIndex;
    val = (Value *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&val);
    while (_unit.word._4_4_ != 0xffffffff) {
      key = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&val,_unit.word._4_4_);
      if (local_59) {
        pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&iterCopyPropSym.current);
        local_1f0 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar10);
      }
      else {
        local_1f0 = (StackSym *)0x0;
      }
      local_108 = local_1f0;
      while( true ) {
        bVar6 = false;
        if (local_108 != (StackSym *)0x0) {
          bVar6 = (local_108->super_Sym).m_id < key;
        }
        if (!bVar6) break;
        bVar6 = Sym::IsStackSym(&local_108->super_Sym);
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x73,"(constSym->IsStackSym())","constSym->IsStackSym()");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pSVar16 = Sym::AsStackSym(&local_108->super_Sym);
        bVar6 = StackSym::HasArgSlotNum(pSVar16);
        if (!bVar6) {
          pJVar2 = this->func->m_alloc;
          pSVar16 = Sym::AsStackSym(&local_108->super_Sym);
          pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&iterCopyPropSym.current);
          BVar17 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Value(pTVar10);
          param2._1_7_ = 0;
          param2.type = BVar17.type;
          param2.u = BVar17.u;
          SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
          ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                    ((EditingIterator *)bailOutConstValuesIter,&pJVar2->super_ArenaAllocator,pSVar16
                     ,param2);
        }
        if (iterConst.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pNVar5 = iterCopyPropSym.current;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_59 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                             *)pNVar5,pSVar9);
        if (local_59) {
          iterConst.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        else {
          iterConst.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_59 = !local_59;
        if (local_59) {
          pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&iterCopyPropSym.current);
          local_228 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar10);
        }
        else {
          local_228 = (StackSym *)0x0;
        }
        local_108 = local_228;
      }
      if ((local_108 != (StackSym *)0x0) && ((local_108->super_Sym).m_id == key)) {
        if (iterConst.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pNVar5 = iterCopyPropSym.current;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_69 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                             *)pNVar5,pSVar9);
        if (local_69) {
          iterConst.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        else {
          iterConst.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_69 = !local_69;
        local_59 = local_69;
      }
      if (local_19) {
        pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&symId);
        local_240 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar11);
      }
      else {
        local_240 = (StackSym *)0x0;
      }
      capturedCopyPropSym = local_240;
      while( true ) {
        bVar6 = false;
        if (capturedCopyPropSym != (StackSym *)0x0) {
          bVar6 = (capturedCopyPropSym->super_Sym).m_id < key;
        }
        if (!bVar6) break;
        pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&symId);
        pSVar16 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Value(pTVar11);
        bVar6 = Sym::IsStackSym(&capturedCopyPropSym->super_Sym);
        if (!bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x87,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).changedSyms,(pSVar16->super_Sym).m_id);
        if (BVar7 == '\0') {
          pSVar12 = Sym::AsStackSym(&capturedCopyPropSym->super_Sym);
          bVar6 = StackSym::HasArgSlotNum(pSVar12);
          if (!bVar6) {
            pJVar2 = this->func->m_alloc;
            pSVar12 = Sym::AsStackSym(&capturedCopyPropSym->super_Sym);
            SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
            EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                      ((EditingIterator *)bailOutCopySymsIter,&pJVar2->super_ArenaAllocator,pSVar12,
                       pSVar16);
          }
        }
        else {
          pSVar16 = Sym::AsStackSym(&capturedCopyPropSym->super_Sym);
          bVar6 = StackSym::HasArgSlotNum(pSVar16);
          if ((!bVar6) &&
             (pVVar13 = GlobOptBlockData::FindValue
                                  (&this->currentBlock->globOptData,&capturedCopyPropSym->super_Sym)
             , pVVar13 != (Value *)0x0)) {
            CaptureCopyPropValue
                      (this,block,&capturedCopyPropSym->super_Sym,pVVar13,bailOutCopySymsIter);
          }
        }
        if (iterCopyPropSym.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pSVar4 = _symId;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(pSVar4,pSVar9);
        if (local_19) {
          iterCopyPropSym.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        else {
          iterCopyPropSym.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_19 = !local_19;
        if (local_19) {
          pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&symId);
          local_270 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar11);
        }
        else {
          local_270 = (StackSym *)0x0;
        }
        capturedCopyPropSym = local_270;
      }
      if ((capturedCopyPropSym != (StackSym *)0x0) && ((capturedCopyPropSym->super_Sym).m_id == key)
         ) {
        if (iterCopyPropSym.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pSVar4 = _symId;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_29 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   ::IsHead(pSVar4,pSVar9);
        if (local_29) {
          iterCopyPropSym.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        else {
          iterCopyPropSym.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_29 = !local_29;
        local_19 = local_29;
      }
      if ((key != 0xffffffff) &&
         (pHVar14 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                              ((block->globOptData).symToValueMap,key), pHVar14 != (HashBucket *)0x0
         )) {
        this_00 = pHVar14->value;
        bVar6 = Sym::IsStackSym(this_00);
        if (bVar6) {
          pSVar16 = Sym::AsStackSym(this_00);
          bVar6 = StackSym::HasByteCodeRegSlot(pSVar16);
          if (!bVar6) {
            pSVar16 = Sym::AsStackSym(this_00);
            bVar6 = StackSym::HasArgSlotNum(pSVar16);
            if (!bVar6) goto LAB_005e4655;
          }
        }
        else {
LAB_005e4655:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0xac,
                             "(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()))"
                             ,
                             "symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum())"
                            );
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pVVar13 = pHVar14->element;
        if (pVVar13 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0xaf,"(val)","val");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        this_01 = ::Value::GetValueInfo(pVVar13);
        pSVar15 = ValueInfo::GetSymStore(this_01);
        if (pSVar15 != (Sym *)0x0) {
          bVar6 = ValueInfo::TryGetIntConstantValue
                            (this_01,(int32 *)((long)&constValue.u.intConst.value + 4),false);
          if (bVar6) {
            BailoutConstantValue::InitIntConstValue
                      ((BailoutConstantValue *)local_158,constValue.u.intConst.value._4_4_);
            pJVar2 = this->func->m_alloc;
            pSVar16 = Sym::AsStackSym(this_00);
            BVar17._0_8_ = (ulong)local_158 & 0xff;
            BVar17.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
            SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
            ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                      ((EditingIterator *)bailOutConstValuesIter,&pJVar2->super_ArenaAllocator,
                       pSVar16,BVar17);
          }
          else {
            bVar6 = ValueInfo::IsVarConstant(this_01);
            if (bVar6) {
              this_02 = ValueInfo::AsVarConstant(this_01);
              value = VarConstantValueInfo::VarValue(this_02,false);
              BailoutConstantValue::InitVarConstValue((BailoutConstantValue *)local_158,value);
              pJVar2 = this->func->m_alloc;
              pSVar16 = Sym::AsStackSym(this_00);
              param2_00._0_8_ = (ulong)local_158 & 0xff;
              param2_00.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
              SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
              ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                        ((EditingIterator *)bailOutConstValuesIter,&pJVar2->super_ArenaAllocator,
                         pSVar16,param2_00);
            }
            else {
              CaptureCopyPropValue(this,block,this_00,pVVar13,bailOutCopySymsIter);
            }
          }
        }
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&val);
    }
    local_79 = local_59;
    local_39 = local_19;
    if (__startIndex == (Type_conflict)0x0) break;
  }
  while (local_79) {
    pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&iterCopyPropSym.current);
    pSVar16 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key(pTVar10);
    bVar6 = Sym::IsStackSym(&pSVar16->super_Sym);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0xd1,"(constSym->IsStackSym())","constSym->IsStackSym()");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).changedSyms,(pSVar16->super_Sym).m_id);
    if (BVar7 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0xd2,"(!block->globOptData.changedSyms->Test(constSym->m_id))",
                         "!block->globOptData.changedSyms->Test(constSym->m_id)");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pSVar12 = Sym::AsStackSym(&pSVar16->super_Sym);
    bVar6 = StackSym::HasArgSlotNum(pSVar12);
    if (!bVar6) {
      pJVar2 = this->func->m_alloc;
      pSVar16 = Sym::AsStackSym(&pSVar16->super_Sym);
      pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)&iterCopyPropSym.current);
      BVar17 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Value(pTVar10);
      param2_01._1_7_ = 0;
      param2_01.type = BVar17.type;
      param2_01.u = BVar17.u;
      SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
      ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                ((EditingIterator *)bailOutConstValuesIter,&pJVar2->super_ArenaAllocator,pSVar16,
                 param2_01);
    }
    if (iterConst.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pNVar5 = iterCopyPropSym.current;
    pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_79 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                         *)pNVar5,pSVar9);
    if (local_79) {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_79 = !local_79;
  }
  do {
    if (!local_39) {
      return;
    }
    pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&symId);
    pSVar16 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(pTVar11);
    pTVar11 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&symId);
    pSVar12 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Value(pTVar11);
    bVar6 = Sym::IsStackSym(&pSVar16->super_Sym);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0xe1,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).changedSyms,(pSVar16->super_Sym).m_id);
    if ((BVar7 != '\0') ||
       (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).changedSyms,(pSVar12->super_Sym).m_id),
       BVar7 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0xe3,
                         "(!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))"
                         ,
                         "!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id)"
                        );
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this_03 = Sym::AsStackSym(&pSVar16->super_Sym);
    bVar6 = StackSym::HasArgSlotNum(this_03);
    if (!bVar6) {
      pJVar2 = this->func->m_alloc;
      pSVar16 = Sym::AsStackSym(&pSVar16->super_Sym);
      SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
      EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                ((EditingIterator *)bailOutCopySymsIter,&pJVar2->super_ArenaAllocator,pSVar16,
                 pSVar12);
    }
    if (iterCopyPropSym.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pSVar4 = _symId;
    pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    local_39 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               ::IsHead(pSVar4,pSVar9);
    if (local_39) {
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
    else {
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_39 = !local_39;
  } while( true );
}

Assistant:

void
GlobOpt::CaptureValuesIncremental(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    CapturedValues * currCapturedValues = block->globOptData.capturedValues;
    SListBase<ConstantStackSymValue>::Iterator iterConst(currCapturedValues ? &currCapturedValues->constantValues : nullptr);
    SListBase<CopyPropSyms>::Iterator iterCopyPropSym(currCapturedValues ? &currCapturedValues->copyPropSyms : nullptr);
    bool hasConstValue = currCapturedValues ? iterConst.Next() : false;
    bool hasCopyPropSym = currCapturedValues ? iterCopyPropSym.Next() : false;

    block->globOptData.changedSyms->Set(Js::Constants::InvalidSymID);

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        Value * val = nullptr;

        // First process all unchanged syms with m_id < symId. Then, recapture the current changed sym.

        // copy unchanged const sym to new capturedValues
        Sym * constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        while (constSym && constSym->m_id < symId)
        {
            Assert(constSym->IsStackSym());
            if (!constSym->AsStackSym()->HasArgSlotNum())
            {
                bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
            }

            hasConstValue = iterConst.Next();
            constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        }
        if (constSym && constSym->m_id == symId)
        {
            hasConstValue = iterConst.Next();
        }

        // process unchanged sym; copy-prop sym might have changed
        Sym * capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        while (capturedSym && capturedSym->m_id < symId)
        {
            StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

            Assert(capturedSym->IsStackSym());

            if (!block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
                }
            }
            else
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    val = this->currentBlock->globOptData.FindValue(capturedSym);
                    if (val != nullptr)
                    {
                        CaptureCopyPropValue(block, capturedSym, val, bailOutCopySymsIter);
                    }
                }
            }

            hasCopyPropSym = iterCopyPropSym.Next();
            capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        }
        if (capturedSym && capturedSym->m_id == symId)
        {
            hasCopyPropSym = iterCopyPropSym.Next();
        }

        // recapture changed sym
        HashBucket<Sym *, Value *> * symIdBucket = nullptr;
        if (symId != Js::Constants::InvalidSymID)
        {
            symIdBucket = block->globOptData.symToValueMap->GetBucket(symId);
            if (symIdBucket != nullptr)
            {
                Sym * symIdSym = symIdBucket->value;
                Assert(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()));

                val = symIdBucket->element;
                Assert(val);
                ValueInfo* valueInfo = val->GetValueInfo();

                if (valueInfo->GetSymStore() != nullptr)
                {
                    int32 intConstValue;
                    BailoutConstantValue constValue;

                    if (valueInfo->TryGetIntConstantValue(&intConstValue))
                    {
                        constValue.InitIntConstValue(intConstValue);
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else if (valueInfo->IsVarConstant())
                    {
                        constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else
                    {
                        CaptureCopyPropValue(block, symIdSym, val, bailOutCopySymsIter);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV

    // If, after going over the set of changed syms since the last time we captured values,
    // there are remaining unprocessed entries in the current captured values set,
    // they can simply be copied over to the new bailout info.
    while (hasConstValue)
    {
        Sym * constSym = iterConst.Data().Key();
        Assert(constSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(constSym->m_id));

        if (!constSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
        }

        hasConstValue = iterConst.Next();
    }

    while (hasCopyPropSym)
    {
        Sym * capturedSym = iterCopyPropSym.Data().Key();
        StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

        Assert(capturedSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(capturedSym->m_id) &&
            !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id));

        if (!capturedSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
        }

        hasCopyPropSym = iterCopyPropSym.Next();
    }
}